

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O2

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::URDFDocument::rootElementForName
          (URDFDocument *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  undefined8 uVar1;
  bool bVar2;
  Model *__args_1;
  XMLElement *this_02;
  XMLParserState *pXVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<iDynTree::XMLElement> sVar5;
  undefined1 local_168 [312];
  
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          packageDirs,"robot");
  if (bVar2) {
    iDynTree::Model::Model((Model *)local_168);
    this_00 = &name->field_2;
    iDynTree::Model::operator=((Model *)this_00->_M_local_buf,(Model *)local_168);
    iDynTree::Model::~Model((Model *)local_168);
    iDynTree::Model::setPackageDirs((vector *)this_00->_M_local_buf);
    std::
    vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
    ::clear((vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
             *)&name[0xb]._M_string_length);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(name + 0xc));
    this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)((long)&name[0xd].field_2 + 8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(this_01);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)&name[0xf].field_2);
    __args_1 = (Model *)iDynTree::XMLDocument::getParserState();
    std::
    make_shared<iDynTree::RobotElement,iDynTree::XMLParserState&,iDynTree::Model&,std::vector<std::shared_ptr<iDynTree::SensorHelper>,std::allocator<std::shared_ptr<iDynTree::SensorHelper>>>&,std::unordered_map<std::__cxx11::string,iDynTree::JointElement::JointInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>>&,std::unordered_map<std::__cxx11::string,iDynTree::JointElement::JointInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>>&,std::unordered_map<std::__cxx11::string,iDynTree::MaterialElement::MaterialInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::MaterialElement::MaterialInfo>>>&,std::unordered_map<std::__cxx11::string,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>>>>&,std::unordered_map<std::__cxx11::string,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>>>>&>
              ((XMLParserState *)local_168,__args_1,
               (vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                *)this_00,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
                *)&name[0xb]._M_string_length,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
                *)(name + 0xc),
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
                *)this_01,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
                *)&name[0xf].field_2,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
                *)&name[0x11]._M_string_length);
    uVar1 = local_168._8_8_;
    local_168._8_8_ = 0;
    *(undefined8 *)this = local_168._0_8_;
    *(undefined8 *)&this->field_0x8 = uVar1;
    local_168._0_8_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
    _Var4._M_pi = extraout_RDX;
  }
  else {
    this_02 = (XMLElement *)operator_new(0x10);
    pXVar3 = (XMLParserState *)iDynTree::XMLDocument::getParserState();
    iDynTree::XMLElement::XMLElement(this_02,pXVar3);
    std::__shared_ptr<iDynTree::XMLElement,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<iDynTree::XMLElement,void>
              ((__shared_ptr<iDynTree::XMLElement,(__gnu_cxx::_Lock_policy)2> *)this,this_02);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<XMLElement> URDFDocument::rootElementForName(const std::string& name,
                                                                 const std::vector<std::string>& packageDirs)
    {
        // allowed tag is <robot>
        if (name == "robot") {
            m_model = iDynTree::Model();
            m_model.setPackageDirs(packageDirs);
            m_buffers.sensorHelpers.clear();
            m_buffers.joints.clear();
            m_buffers.fixedJoints.clear();
            m_buffers.materials.clear();

            return std::make_shared<RobotElement>(getParserState(), 
                                                  m_model,
                                                  m_buffers.sensorHelpers,
                                                  m_buffers.joints,
                                                  m_buffers.fixedJoints,
                                                  m_buffers.materials,
                                                  m_buffers.visuals,
                                                  m_buffers.collisions);
        }
        // TODO: raise an error here
        return std::shared_ptr<XMLElement>(new XMLElement(getParserState()));
    }